

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int ffhist2e(fitsfile **fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],
            char **colexpr,double *minin,double *maxin,double *binsizein,char (*minname) [71],
            char (*maxname) [71],char (*binname) [71],double weightin,char *wtcol,char *wtexpr,
            int recip,char *selectrow,int *status)

{
  fitsfile *fptr_00;
  char **colexpr_00;
  int iVar1;
  char *err_message;
  uint local_22c;
  double weight;
  long wtrepeat;
  int local_214;
  char **local_210;
  long nelem;
  long vectorRepeat;
  double local_1f8;
  int naxis1;
  int datatypes [4];
  int colnum [4];
  int wtcolnum;
  double binsize [4];
  double amin [4];
  long haxes [4];
  double amax [4];
  fitsfile *histptr;
  
  local_22c = 0;
  wtrepeat = 0;
  if (0 < *status) {
    return *status;
  }
  if (4 < naxis) {
    err_message = "histogram has more than 4 dimensions";
LAB_00175f95:
    ffpmsg(err_message);
    *status = 0x140;
    goto LAB_0017622b;
  }
  fptr_00 = *fptr;
  local_210 = colexpr;
  local_1f8 = weightin;
  if (fptr_00->HDUposition != fptr_00->Fptr->curhdu) {
    ffmahd(fptr_00,fptr_00->HDUposition + 1,(int *)0x0,status);
  }
  if (imagetype < 0x1f) {
    local_214 = 8;
    if (imagetype == 0xb) goto LAB_00176021;
    if (imagetype == 0x15) {
      local_214 = 0x10;
      goto LAB_00176021;
    }
LAB_00176225:
    *status = 0x19a;
  }
  else {
    if (imagetype == 0x1f) {
      local_214 = 0x20;
    }
    else if (imagetype == 0x2a) {
      local_214 = -0x20;
    }
    else {
      if (imagetype != 0x52) goto LAB_00176225;
      local_214 = -0x40;
    }
LAB_00176021:
    iVar1 = fits_calc_binningde(*fptr,naxis,colname,local_210,minin,maxin,binsizein,minname,maxname,
                                binname,colnum,datatypes,haxes,amin,amax,binsize,&vectorRepeat,
                                status);
    if (iVar1 < 1) {
      if (*wtcol == '\0') {
        if ((wtexpr == (char *)0x0) || (*wtexpr == '\0')) {
          weight = local_1f8;
          wtrepeat = vectorRepeat;
          local_22c = 0x52;
        }
        else {
          ffiprs(*fptr,0,wtexpr,5,(int *)&local_22c,&nelem,&naxis1,(long *)&wtcolnum,
                 (ParseData *)&histptr,status);
          ffcprs((ParseData *)&histptr);
          if (nelem < 0) {
            nelem = 1;
          }
          weight = -9.1191291391491e-36;
          wtrepeat = nelem;
        }
      }
      else {
        iVar1 = ffgky(*fptr,0x52,wtcol,&weight,(char *)0x0,status);
        if (iVar1 == 0) {
          local_22c = 0x52;
          wtrepeat = 1;
        }
        else {
          *status = 0;
          iVar1 = ffgcno(*fptr,0,wtcol,&wtcolnum,status);
          if (0 < iVar1) {
            ffpmsg("keyword or column for histogram weights doesn\'t exist: ");
            goto LAB_001760ac;
          }
          ffeqty(*fptr,wtcolnum,(int *)&local_22c,&wtrepeat,(long *)0x0,status);
          weight = -9.1191291391491e-36;
        }
      }
      if (((int)local_22c < 0) ||
         ((local_22c < 0x11 && ((0x14002U >> (local_22c & 0x1f) & 1) != 0)))) {
        ffpmsg("Invalid datatype for bin weighting factor");
        goto LAB_00176225;
      }
      if (wtrepeat != vectorRepeat) {
        err_message = "Vector dimensions of weighting do not agree with binning columns";
        goto LAB_00175f95;
      }
      if ((weight <= 0.0) && ((weight != -9.1191291391491e-36 || (NAN(weight))))) {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        *status = 0x7d;
        goto LAB_0017622b;
      }
      if ((recip != 0) && ((weight != -9.1191291391491e-36 || (NAN(weight))))) {
        weight = 1.0 / weight;
      }
      iVar1 = ffinit(&histptr,outfile,status);
      if (iVar1 < 1) {
        iVar1 = ffcrim(histptr,local_214,naxis,haxes,status);
        if (iVar1 < 1) {
          iVar1 = fits_copy_pixlist2image(*fptr,histptr,9,naxis,colnum,status);
          colexpr_00 = local_210;
          if (iVar1 < 1) {
            fits_write_keys_histoe(*fptr,histptr,naxis,colnum,colname,local_210,status);
            fits_rebin_wcsd(histptr,naxis,amin,binsize,status);
            iVar1 = fits_make_histde(*fptr,histptr,datatypes,local_214,naxis,haxes,colnum,colexpr_00
                                     ,amin,amax,binsize,weight,wtcolnum,wtexpr,recip,selectrow,
                                     status);
            if (iVar1 < 1) {
              ffclos(*fptr,status);
              *fptr = histptr;
              goto LAB_0017622b;
            }
            wtcol = "failed to calculate new histogram values";
          }
          else {
            wtcol = "failed to copy pixel list keywords to new histogram header";
          }
        }
        else {
          wtcol = "failed to create output histogram FITS image";
        }
      }
      else {
        wtcol = "failed to create temp output file for histogram";
      }
    }
    else {
      wtcol = "failed to determine binning parameters";
    }
LAB_001760ac:
    ffpmsg(wtcol);
  }
LAB_0017622b:
  return *status;
}

Assistant:

int ffhist2e(fitsfile **fptr,  /* IO - pointer to table with X and Y cols;    */
                             /*     on output, points to histogram image    */
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
	   char *colexpr[4], /* I - optionally, expression intead of colum  */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
	   char *wtexpr,           /* I - optionally, weight expression     */
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    fitsfile *histptr;
    int   bitpix, colnum[4], wtcolnum;
    long haxes[4];
    double amin[4], amax[4], binsize[4],  weight;
    int numIterCols = 0;
    int datatypes[4], wtdatatype = 0;
    long *repeat, wtrepeat = 0;
    char errmsg[FLEN_ERRMSG];
    long vectorRepeat;

    if (*status > 0)
        return(*status);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        *status = BAD_DIMEN;
	goto cleanup;
    }

    /* reset position to the correct HDU if necessary */
    if ((*fptr)->HDUposition != ((*fptr)->Fptr)->curhdu)
        ffmahd(*fptr, ((*fptr)->HDUposition) + 1, NULL, status);

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else {
        *status = BAD_DATATYPE;
      	goto cleanup;
    }
    
    /*    Calculate the binning parameters:    */
    /*   columm numbers, axes length, min values,  max values, and binsizes.  */

    if (fits_calc_binningde(
      *fptr, naxis, colname, colexpr, 
      minin, maxin, binsizein, minname, maxname, binname,
      colnum, datatypes, haxes, amin, amax, binsize, 
      &vectorRepeat, status) > 0)
    {
        ffpmsg("failed to determine binning parameters");
      	goto cleanup;
    }
 
    /* get the histogramming weighting factor, if any */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (ffgky(*fptr, TDOUBLE, wtcol, &weight, NULL, status) == 0)
	{
	  /* Data type if keyword was found */
	  wtdatatype = TDOUBLE;
	  wtrepeat   = 1;
	}
	else
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(*fptr, CASEINSEN, wtcol, &wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
	       goto cleanup;
            }

	    /* get the datatype of the column */
	    fits_get_eqcoltype(*fptr, wtcolnum, &wtdatatype,
			       &wtrepeat, NULL, status);

            weight = DOUBLENULLVALUE;
        } 
    }
    else if (wtexpr && wtexpr[0])  /* A weighting expression - always TDOUBLE */
    {     
      /* Initialize the parser so that we can determine the datatype
	 of the returned type as well as the vector dimensions.  The
	 parsers is kept allocated so we can assemble an iterator that
	 uses it below.
      */
      int naxis1;
      long int nelem, naxes[MAXDIMS];
      ParseData lParse;

      ffiprs( *fptr, 0, wtexpr, MAXDIMS, &wtdatatype, &nelem, &naxis1,
	      naxes, &lParse, status );
      ffcprs( &lParse );
      if (nelem < 0) nelem = 1; /* If it's a constant expression */

      weight = DOUBLENULLVALUE;
      wtrepeat = nelem;
      wtdatatype = wtdatatype;

    }
    else
    {
        weight = (double) weightin;
	wtrepeat = vectorRepeat;
	wtdatatype = TDOUBLE;
    }

    /* Make sure weighting column is not an un-binnable data type */
    if (wtdatatype < 0 || wtdatatype == TSTRING || wtdatatype == TBIT || 
	wtdatatype == TLOGICAL) {
      ffpmsg("Invalid datatype for bin weighting factor");
      *status = BAD_DATATYPE;
      goto cleanup;
    }

    /* And dimensions of weighting must agree with input column data */
    if (wtrepeat != vectorRepeat) {
      ffpmsg("Vector dimensions of weighting do not agree with binning columns");
      *status = BAD_DIMEN;
      goto cleanup;
    }      

    if (weight <= 0. && weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        *status = URL_PARSE_ERROR;
	goto cleanup;
    }

    if (recip && weight != DOUBLENULLVALUE) {
       /* take reciprocal of weight */
       weight = (double) (1.0 / weight);
    }


    /* size of histogram is now known, so create temp output file */
    if (fits_create_file(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
	goto cleanup;
    }

    /* create output FITS image HDU */
    if (ffcrim(histptr, bitpix, naxis, haxes, status) > 0)
    {
        ffpmsg("failed to create output histogram FITS image");
	goto cleanup;
    }

    /* copy header keywords, converting pixel list WCS keywords to image WCS form */
    if (fits_copy_pixlist2image(*fptr, histptr, 9, naxis, colnum, status) > 0)
    {
        ffpmsg("failed to copy pixel list keywords to new histogram header");
	goto cleanup;
    }

    /* if the table columns have no WCS keywords, then write default keywords */
    fits_write_keys_histoe(*fptr, histptr, naxis, colnum, colname, colexpr, status);
    
    /* update the WCS keywords for the ref. pixel location, and pixel size */
    fits_rebin_wcsd(histptr, naxis, amin, binsize,  status);      
    
    /* now compute the output image by binning the column values */
    if (fits_make_histde(*fptr, histptr, datatypes, bitpix, naxis, haxes, 
			 colnum, colexpr, amin, amax, binsize,
			 weight, wtcolnum, wtexpr, recip, 
			 selectrow, status) > 0)
    {
        ffpmsg("failed to calculate new histogram values");
	goto cleanup;
    }
              
    /* finally, close the original file and return ptr to the new image */
    ffclos(*fptr, status);
    *fptr = histptr;

 cleanup:
    return(*status);
}